

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O2

void __thiscall Assimp::FileSystemFilter::BuildPath(FileSystemFilter *this,string *in)

{
  IOSystem *pIVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  string tmp;
  string local_50 [32];
  
  pIVar1 = this->mWrapped;
  if (pIVar1 == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                  ,0xe1,"void Assimp::FileSystemFilter::BuildPath(std::string &) const");
  }
  if (in->_M_string_length < 3) {
    return;
  }
  iVar2 = (*pIVar1->_vptr_IOSystem[2])(pIVar1,(in->_M_dataplus)._M_p);
  if ((char)iVar2 != '\0') {
    return;
  }
  if ((in->_M_dataplus)._M_p[1] != ':') {
    std::operator+(&tmp,&this->mBase,in);
    iVar2 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,tmp._M_dataplus._M_p);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::_M_assign((string *)in);
      goto LAB_001371da;
    }
    std::__cxx11::string::~string((string *)&tmp);
  }
  cVar4 = (char)in;
  lVar3 = std::__cxx11::string::rfind(cVar4,0x2f);
  if ((lVar3 == -1) && (lVar3 = std::__cxx11::string::rfind(cVar4,0x5c), lVar3 == -1)) {
    return;
  }
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  do {
    std::__cxx11::string::_M_assign((string *)&tmp);
    std::__cxx11::string::push_back((char)&tmp);
    lVar3 = std::__cxx11::string::rfind(cVar4,0x2f);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::rfind(cVar4,0x5c);
    }
    if (lVar3 + 1U < 2) goto LAB_001371da;
    std::__cxx11::string::substr((ulong)local_50,(ulong)in);
    std::__cxx11::string::append((string *)&tmp);
    std::__cxx11::string::~string(local_50);
    iVar2 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,tmp._M_dataplus._M_p);
  } while ((char)iVar2 == '\0');
  std::__cxx11::string::_M_assign((string *)in);
LAB_001371da:
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void BuildPath (std::string& in) const {
        ai_assert( nullptr != mWrapped );
        // if we can already access the file, great.
        if (in.length() < 3 || mWrapped->Exists(in)) {
            return;
        }

        // Determine whether this is a relative path (Windows-specific - most assets are packaged on Windows).
        if (in[1] != ':') {

            // append base path and try
            const std::string tmp = mBase + in;
            if (mWrapped->Exists(tmp)) {
                in = tmp;
                return;
            }
        }

        // Chop of the file name and look in the model directory, if
        // this fails try all sub paths of the given path, i.e.
        // if the given path is foo/bar/something.lwo, try
        // <base>/something.lwo
        // <base>/bar/something.lwo
        // <base>/foo/bar/something.lwo
        std::string::size_type pos = in.rfind('/');
        if (std::string::npos == pos) {
            pos = in.rfind('\\');
        }

        if (std::string::npos != pos)   {
            std::string tmp;
            std::string::size_type last_dirsep = std::string::npos;

            while(true) {
                tmp = mBase;
                tmp += mSep;

                std::string::size_type dirsep = in.rfind('/', last_dirsep);
                if (std::string::npos == dirsep) {
                    dirsep = in.rfind('\\', last_dirsep);
                }

                if (std::string::npos == dirsep || dirsep == 0) {
                    // we did try this already.
                    break;
                }

                last_dirsep = dirsep-1;

                tmp += in.substr(dirsep+1, in.length()-pos);
                if (mWrapped->Exists(tmp)) {
                    in = tmp;
                    return;
                }
            }
        }

        // hopefully the underlying file system has another few tricks to access this file ...
    }